

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

void Corrade::Utility::String::Implementation::anon_unknown_13::anon_func::anon_class_1_0_00000001::
     __invoke(char *data,size_t size,char search,char replace)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 (*pauVar6) [32];
  ostream *output;
  undefined1 (*pauVar7) [32];
  undefined1 (*pauVar8) [32];
  char in_R8B;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  Error EStack_30;
  
  if (size < 0x20) {
    operator()((anon_class_1_0_00000001 *)data,(char *)size,(ulong)(uint)(int)search,replace,in_R8B)
    ;
    return;
  }
  pauVar6 = (undefined1 (*) [32])((ulong)(data + 0x20) & 0xffffffffffffffe0);
  if (data < pauVar6) {
    auVar9[1] = search;
    auVar9[0] = search;
    auVar9[2] = search;
    auVar9[3] = search;
    auVar9[4] = search;
    auVar9[5] = search;
    auVar9[6] = search;
    auVar9[7] = search;
    auVar9[8] = search;
    auVar9[9] = search;
    auVar9[10] = search;
    auVar9[0xb] = search;
    auVar9[0xc] = search;
    auVar9[0xd] = search;
    auVar9[0xe] = search;
    auVar9[0xf] = search;
    auVar9[0x10] = search;
    auVar9[0x11] = search;
    auVar9[0x12] = search;
    auVar9[0x13] = search;
    auVar9[0x14] = search;
    auVar9[0x15] = search;
    auVar9[0x16] = search;
    auVar9[0x17] = search;
    auVar9[0x18] = search;
    auVar9[0x19] = search;
    auVar9[0x1a] = search;
    auVar9[0x1b] = search;
    auVar9[0x1c] = search;
    auVar9[0x1d] = search;
    auVar9[0x1e] = search;
    auVar9[0x1f] = search;
    auVar10[1] = replace;
    auVar10[0] = replace;
    auVar10[2] = replace;
    auVar10[3] = replace;
    auVar10[4] = replace;
    auVar10[5] = replace;
    auVar10[6] = replace;
    auVar10[7] = replace;
    auVar10[8] = replace;
    auVar10[9] = replace;
    auVar10[10] = replace;
    auVar10[0xb] = replace;
    auVar10[0xc] = replace;
    auVar10[0xd] = replace;
    auVar10[0xe] = replace;
    auVar10[0xf] = replace;
    auVar10[0x10] = replace;
    auVar10[0x11] = replace;
    auVar10[0x12] = replace;
    auVar10[0x13] = replace;
    auVar10[0x14] = replace;
    auVar10[0x15] = replace;
    auVar10[0x16] = replace;
    auVar10[0x17] = replace;
    auVar10[0x18] = replace;
    auVar10[0x19] = replace;
    auVar10[0x1a] = replace;
    auVar10[0x1b] = replace;
    auVar10[0x1c] = replace;
    auVar10[0x1d] = replace;
    auVar10[0x1e] = replace;
    auVar10[0x1f] = replace;
    auVar1 = vpcmpeqb_avx2(*(undefined1 (*) [32])data,auVar9);
    auVar1 = vpblendvb_avx2(*(undefined1 (*) [32])data,auVar10,auVar1);
    *(undefined1 (*) [32])data = auVar1;
    pauVar8 = (undefined1 (*) [32])(data + size);
    pauVar7 = pauVar6 + 4;
    while (pauVar7 <= pauVar8) {
      auVar1 = vpcmpeqb_avx2(*pauVar6,auVar9);
      auVar2 = vpcmpeqb_avx2(pauVar6[1],auVar9);
      auVar3 = vpcmpeqb_avx2(pauVar6[2],auVar9);
      auVar4 = vpcmpeqb_avx2(pauVar6[3],auVar9);
      auVar11 = vpor_avx2(auVar4,auVar3);
      auVar5 = vpor_avx2(auVar1,auVar2);
      auVar11 = vpor_avx2(auVar5,auVar11);
      auVar11 = vpsllw_avx2(auVar11,7);
      if ((((((((((((((((((((((((((((((((auVar11 >> 7 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar11 >> 0xf & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar11 >> 0x17 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar11 >> 0x1f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar11 >> 0x27 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar11 >> 0x2f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar11 >> 0x37 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar11 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar11 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar11 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar11 >> 0x57 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar11 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar11 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar11 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar11 >> 0x7f,0) != '\0') ||
                        (auVar11 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar11 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar11 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar11 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar11 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar11 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar11 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar11 >> 0xbf,0) != '\0') ||
                (auVar11 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar11 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar11 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar11 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar11 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           (auVar11 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar11 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          auVar11[0x1f] < '\0') {
        auVar1 = vpblendvb_avx2(*pauVar6,auVar10,auVar1);
        auVar2 = vpblendvb_avx2(pauVar6[1],auVar10,auVar2);
        auVar3 = vpblendvb_avx2(pauVar6[2],auVar10,auVar3);
        auVar4 = vpblendvb_avx2(pauVar6[3],auVar10,auVar4);
        *pauVar6 = auVar1;
        pauVar6[1] = auVar2;
        pauVar6[2] = auVar3;
        pauVar6[3] = auVar4;
      }
      pauVar7 = pauVar6 + 8;
      pauVar6 = pauVar6 + 4;
    }
    pauVar7 = pauVar6 + 1;
    while (pauVar7 <= pauVar8) {
      auVar1 = vpcmpeqb_avx2(*pauVar6,auVar9);
      auVar1 = vpblendvb_avx2(*pauVar6,auVar10,auVar1);
      *pauVar6 = auVar1;
      pauVar7 = pauVar6 + 2;
      pauVar6 = pauVar6 + 1;
    }
    if (pauVar6 < pauVar8) {
      auVar1 = vpcmpeqb_avx2(pauVar8[-1],auVar9);
      auVar1 = vpblendvb_avx2(pauVar8[-1],auVar10,auVar1);
      pauVar8[-1] = auVar1;
    }
    return;
  }
  output = Error::defaultOutput();
  Error::Error(&EStack_30,output,(Flags)0x0);
  Debug::operator<<(&EStack_30.super_Debug,
                    "Assertion i > data && reinterpret_cast<std::uintptr_t>(i) % 32 == 0 failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/String.cpp:1274"
                   );
  Error::~Error(&EStack_30);
  abort();
}

Assistant:

CORRADE_UTILITY_CPU_MAYBE_UNUSED CORRADE_ENABLE_AVX2 typename std::decay<decltype(replaceAllInPlaceCharacter)>::type replaceAllInPlaceCharacterImplementation(Cpu::Avx2T) {
  return [](char* const data, const std::size_t size, const char search, const char replace) CORRADE_ENABLE_AVX2 {
    /* If we have less than 32 bytes, fall back to the SSE variant */
    /** @todo deinline it here? any speed gains from rewriting using 128-bit
        AVX? or does the compiler do that automatically? */
    if(size < 32)
        return replaceAllInPlaceCharacterImplementation(Cpu::Sse41)(data, size, search, replace);

    const __m256i vsearch = _mm256_set1_epi8(search);
    const __m256i vreplace = _mm256_set1_epi8(replace);

    /* Calculate the next aligned position. If the pointer was already aligned,
       we'll go to the next aligned vector; if not, there will be an overlap
       and we'll process some bytes twice. */
    char* i = reinterpret_cast<char*>(reinterpret_cast<std::uintptr_t>(data + 32) & ~0x1f);
    CORRADE_INTERNAL_DEBUG_ASSERT(i > data && reinterpret_cast<std::uintptr_t>(i) % 32 == 0);

    /* Unconditionally process the first vector a slower, unaligned way. Do the
       replacement unconditionally because it's faster than checking first. */
    {
        /* _mm256_lddqu_si256 is just an alias to _mm256_loadu_si256, no reason
           to use it: https://stackoverflow.com/a/47426790 */
        const __m256i in = _mm256_loadu_si256(reinterpret_cast<const __m256i*>(data));
        const __m256i out = _mm256_blendv_epi8(in, vreplace, _mm256_cmpeq_epi8(in, vsearch));
        _mm256_storeu_si256(reinterpret_cast<__m256i*>(data), out);
    }

    /* Go four aligned vectors at a time. Bytes overlapping with the previous
       unaligned load will be processed twice, but as everything is already
       replaced there, it'll be a no-op for those. Similarly to the SSE2
       implementation, this reduces the branching overhead compared to
       branching on every vector, making it comparable to an unconditional
       replace with a character that occurs often, but significantly faster for
       characters that are rare. For comparison see StringTest.h and the
       replaceAllInPlaceCharacterImplementationAvx2Unconditional() variant. */
    char* const end = data + size;
    for(; i + 4*32 <= end; i += 4*32) {
        const __m256i inA = _mm256_load_si256(reinterpret_cast<const __m256i*>(i) + 0);
        const __m256i inB = _mm256_load_si256(reinterpret_cast<const __m256i*>(i) + 1);
        const __m256i inC = _mm256_load_si256(reinterpret_cast<const __m256i*>(i) + 2);
        const __m256i inD = _mm256_load_si256(reinterpret_cast<const __m256i*>(i) + 3);

        const __m256i eqA = _mm256_cmpeq_epi8(inA, vsearch);
        const __m256i eqB = _mm256_cmpeq_epi8(inB, vsearch);
        const __m256i eqC = _mm256_cmpeq_epi8(inC, vsearch);
        const __m256i eqD = _mm256_cmpeq_epi8(inD, vsearch);

        const __m256i or1 = _mm256_or_si256(eqA, eqB);
        const __m256i or2 = _mm256_or_si256(eqC, eqD);
        const __m256i or3 = _mm256_or_si256(or1, or2);
        /* If any of the four vectors contained the character, replace all of
           them -- branching again on each would hurt the "common character"
           case */
        if(_mm256_movemask_epi8(or3)) {
            const __m256i outA = _mm256_blendv_epi8(inA, vreplace, eqA);
            const __m256i outB = _mm256_blendv_epi8(inB, vreplace, eqB);
            const __m256i outC = _mm256_blendv_epi8(inC, vreplace, eqC);
            const __m256i outD = _mm256_blendv_epi8(inD, vreplace, eqD);

            _mm256_store_si256(reinterpret_cast<__m256i*>(i) + 0, outA);
            _mm256_store_si256(reinterpret_cast<__m256i*>(i) + 1, outB);
            _mm256_store_si256(reinterpret_cast<__m256i*>(i) + 2, outC);
            _mm256_store_si256(reinterpret_cast<__m256i*>(i) + 3, outD);
        }
    }

    /* Handle remaining less than four aligned vectors. Again do the
       replacement unconditionally. */
    for(; i + 32 <= end; i += 32) {
        const __m256i in = _mm256_load_si256(reinterpret_cast<const __m256i*>(i));
        const __m256i out = _mm256_blendv_epi8(in, vreplace, _mm256_cmpeq_epi8(in, vsearch));
        _mm256_store_si256(reinterpret_cast<__m256i*>(i), out);
    }

    /* Handle remaining less than a vector in an unaligned way, again
       unconditionally and again overlapping bytes are no-op. */
    if(i < end) {
        CORRADE_INTERNAL_DEBUG_ASSERT(i + 32 > end);
        i = end - 32;
        /* _mm256_lddqu_si256 is just an alias to _mm256_loadu_si256, no reason
           to use it: https://stackoverflow.com/a/47426790 */
        const __m256i in = _mm256_loadu_si256(reinterpret_cast<const __m256i*>(i));
        const __m256i out = _mm256_blendv_epi8(in, vreplace, _mm256_cmpeq_epi8(in, vsearch));
        _mm256_storeu_si256(reinterpret_cast<__m256i*>(i), out);
    }
  };
}